

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfile_test.cpp
# Opt level: O0

int main(void)

{
  char *pcVar1;
  size_t sVar2;
  __cxx11 local_98 [8];
  string sId;
  long local_78;
  longlong i_1;
  int local_5c;
  string local_58 [4];
  int i;
  string str;
  undefined1 local_38 [8];
  LogFile logfile;
  
  logfile.m_lastRollTime._4_4_ = 0;
  LogFile::LogFile((LogFile *)local_38);
  std::__cxx11::string::string(local_58);
  for (local_5c = 0; local_5c < 0x1a; local_5c = local_5c + 1) {
    std::__cxx11::string::push_back((char)local_58);
  }
  for (local_78 = 0; local_78 < 100000000000000000; local_78 = local_78 + 1) {
    std::__cxx11::to_string(local_98,local_78);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    sVar2 = std::__cxx11::string::size();
    LogFile::Append((LogFile *)local_38,pcVar1,sVar2);
    LogFile::Append((LogFile *)local_38," : ",3);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    sVar2 = std::__cxx11::string::size();
    LogFile::Append((LogFile *)local_38,pcVar1,sVar2);
    LogFile::Append((LogFile *)local_38,"\n",1);
    usleep(1000000);
    if (10 < local_78) {
      logfile.m_lastRollTime._4_4_ = 0;
    }
    std::__cxx11::string::~string((string *)local_98);
    if (10 < local_78) break;
  }
  std::__cxx11::string::~string(local_58);
  LogFile::~LogFile((LogFile *)local_38);
  return logfile.m_lastRollTime._4_4_;
}

Assistant:

int main()
{
	LogFile logfile;
	string str;
	for (int i = 0; i < 26; ++i)
	{
		str.push_back('a' + i);
	}
	
	for (long long i = 0; i < 100000000000000000; ++i)
	{
		string sId = to_string(i);
		logfile.Append(sId.c_str(), sId.size());
		logfile.Append(" : ", 3);
		logfile.Append(str.c_str(), str.size());
		logfile.Append("\n", 1);
		usleep(1000000);
		if (10 < i)
		{
			return 0;
		}
	}
}